

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool CheckMissingStyleSheets(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  Attribute *pAVar2;
  int iVar3;
  Bool BVar4;
  TidyDocImpl *doc_00;
  AttVal *pAVar5;
  bool bVar6;
  
  doc_00 = (TidyDocImpl *)(doc->root).content;
  if (doc_00 == (TidyDocImpl *)0x0) {
    BVar4 = no;
  }
  else {
    do {
      pDVar1 = (doc_00->root).tag;
      if (pDVar1 == (Dict *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = pDVar1->id == TidyTag_LINK;
        if (((pDVar1 != (Dict *)0x0 && !bVar6) &&
            (bVar6 = pDVar1->id == TidyTag_STYLE, pDVar1 != (Dict *)0x0 && !bVar6)) &&
           (bVar6 = pDVar1->id == TidyTag_FONT, pDVar1 != (Dict *)0x0 && !bVar6)) {
          bVar6 = pDVar1->id == TidyTag_BASEFONT;
        }
      }
      pAVar5 = (doc_00->root).attributes;
      if (pAVar5 != (AttVal *)0x0 && !bVar6) {
        do {
          pAVar2 = pAVar5->dict;
          if (pAVar2 == (Attribute *)0x0) {
            bVar6 = false;
          }
          else {
            bVar6 = pAVar2->id == TidyAttr_STYLE;
            if (((pAVar2 != (Attribute *)0x0 && !bVar6) &&
                (bVar6 = pAVar2->id == TidyAttr_TEXT, pAVar2 != (Attribute *)0x0 && !bVar6)) &&
               ((bVar6 = pAVar2->id == TidyAttr_VLINK, pAVar2 != (Attribute *)0x0 && !bVar6 &&
                (bVar6 = pAVar2->id == TidyAttr_ALINK, pAVar2 != (Attribute *)0x0 && !bVar6)))) {
              bVar6 = pAVar2->id == TidyAttr_LINK;
            }
          }
          if ((pAVar2 != (Attribute *)0x0) && (!bVar6)) {
            if ((pAVar2->id == TidyAttr_REL) && (pAVar5->value != (ctmbstr)0x0)) {
              node = (Node *)0x1839a6;
              iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"stylesheet");
              bVar6 = iVar3 == 0;
            }
            else {
              bVar6 = false;
            }
          }
        } while ((!bVar6) && (pAVar5 = pAVar5->next, pAVar5 != (AttVal *)0x0));
      }
      BVar4 = yes;
      if (!bVar6) {
        BVar4 = CheckMissingStyleSheets(doc_00,node);
      }
    } while ((BVar4 == no) &&
            (doc_00 = (TidyDocImpl *)(doc_00->root).next, doc_00 != (TidyDocImpl *)0x0));
  }
  return BVar4;
}

Assistant:

static Bool CheckMissingStyleSheets( TidyDocImpl* doc, Node* node )
{
    AttVal* av;
    Node* content;
    Bool sspresent = no;

    for ( content = node->content;
          !sspresent && content != NULL;
          content = content->next )
    {
        sspresent = ( nodeIsLINK(content)  ||
                      nodeIsSTYLE(content) ||
                      nodeIsFONT(content)  ||
                      nodeIsBASEFONT(content) );

        for ( av = content->attributes;
              !sspresent && av != NULL;
              av = av->next )
        {
            sspresent = ( attrIsSTYLE(av) || attrIsTEXT(av)  ||
                          attrIsVLINK(av) || attrIsALINK(av) ||
                          attrIsLINK(av) );

            if ( !sspresent && attrIsREL(av) )
            {
                sspresent = AttrValueIs(av, "stylesheet");
            }
        }

        if ( ! sspresent )
            sspresent = CheckMissingStyleSheets( doc, content );
    }
    return sspresent;
}